

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float16 float16_scalbn_sparc64(float16 a,int n,float_status *status)

{
  FloatParts FVar1;
  
  FVar1._8_8_ = (ulong)(a >> 10 & 0x1f) | (ulong)(a & 0x8000) << 0x19;
  FVar1.frac = (ulong)(a & 0x3ff);
  FVar1 = sf_canonicalize(FVar1,&float16_params,status);
  FVar1 = scalbn_decomposed(FVar1,n,status);
  FVar1 = round_canonical(FVar1,status,&float16_params);
  return (ushort)FVar1.frac & 0x3ff | (ushort)((FVar1.exp & 0x1fU) << 10) |
         (ushort)(FVar1._8_8_ >> 0x19) & 0x8000;
}

Assistant:

float16 float16_scalbn(float16 a, int n, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pr = scalbn_decomposed(pa, n, status);
    return float16_round_pack_canonical(pr, status);
}